

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O1

void __thiscall
optimization::graph_color::Conflict_Map::Conflict_Map
          (Conflict_Map *this,
          shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
          *color_map,MirFunction *func,u_int color_num)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  uint uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  char cVar5;
  int iVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  long lVar8;
  undefined8 uVar9;
  size_type sVar10;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  _Rb_tree_node_base *p_Var13;
  _Base_ptr p_Var14;
  _Rb_tree_header *p_Var15;
  char *pcVar16;
  Function *tag;
  uint32_t uVar17;
  _Base_ptr p_Var18;
  _Base_ptr p_Var19;
  VarId var;
  VarId var_1;
  ostream local_189;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined1 local_130;
  undefined7 uStack_12f;
  undefined1 local_120;
  Function local_118;
  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  *local_c0;
  _Base_ptr local_b8;
  undefined **local_b0;
  undefined4 local_a8;
  undefined **local_a0;
  undefined8 local_98;
  undefined1 local_90;
  _Base_ptr local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  VarId local_70;
  _func_int **local_60;
  undefined4 local_58;
  undefined1 local_50 [16];
  VarId local_40;
  
  p_Var1 = &(this->static_Map)._M_t._M_impl.super__Rb_tree_header;
  (this->static_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->static_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->static_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->static_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->static_Map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header;
  (this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0 = &this->merged_var_Map;
  p_Var1 = &(this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header;
  (this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88 = &(this->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_88;
  (this->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_88;
  (this->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var15 = &(this->edge_vars)._M_t._M_impl.super__Rb_tree_header;
  (this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var15->_M_header;
  (this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var15->_M_header;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  tag = (Function *)0x0;
  std::_Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::_M_initialize_map
            ((_Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&this->remove_Nodes
             ,0);
  (this->color_map).
  super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (color_map->
            super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  p_Var4 = (color_map->
           super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->color_map).
  super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var4;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  (this->unused_colors).
  super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->unused_colors).
  super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var15 = &(this->priority_map)._M_t._M_impl.super__Rb_tree_header;
  (this->priority_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->priority_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->priority_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var15->_M_header;
  (this->priority_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var15->_M_header;
  (this->priority_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->func = func;
  this->color_num = color_num;
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  p_Var7->_M_use_count = 1;
  p_Var7->_M_weak_count = 1;
  p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001eea40;
  p_Var7[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var7[2]._M_use_count = 0;
  p_Var7[2]._M_weak_count = 0;
  p_Var7[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var7[3]._M_use_count = 0;
  p_Var7[3]._M_weak_count = 0;
  p_Var7[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var7[1]._M_use_count = 0;
  p_Var7[1]._M_weak_count = 0;
  *(_Atomic_word **)&p_Var7[2]._M_use_count = &p_Var7[1]._M_use_count;
  p_Var7[3]._vptr__Sp_counted_base = (_func_int **)&p_Var7[1]._M_use_count;
  p_Var7[3]._M_use_count = 0;
  p_Var7[3]._M_weak_count = 0;
  (this->unused_colors).
  super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)(p_Var7 + 1);
  p_Var4 = (this->unused_colors).
           super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->unused_colors).
  super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var7;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  local_118._vptr_Function._0_4_ = 0;
  uVar3 = (uint)local_118._vptr_Function;
  local_118._vptr_Function._0_4_ = 0;
  if (color_num != 0) {
    do {
      tag = &local_118;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 (this->unused_colors).
                 super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(int *)&local_118);
      local_118._vptr_Function._0_4_ = (uint)local_118._vptr_Function + 1;
      uVar3 = (uint)local_118._vptr_Function;
    } while ((uint)local_118._vptr_Function < color_num);
  }
  local_118._vptr_Function._0_4_ = uVar3;
  if ((func->variables)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    iVar6 = 0xffff;
  }
  else {
    lVar8 = std::_Rb_tree_decrement(&(func->variables)._M_t._M_impl.super__Rb_tree_header._M_header)
    ;
    iVar6 = *(int *)(lVar8 + 0x20);
  }
  this->varId = iVar6;
  p_Var12 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_80 = &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var12 != local_80) {
    psVar2 = &local_118.name;
    do {
      p_Var19 = p_Var12[3]._M_parent;
      p_Var18 = p_Var12[3]._M_left;
      local_b8 = p_Var18;
      local_78 = p_Var12;
      if (p_Var19 != p_Var18) {
        do {
          iVar6 = (**(code **)(**(long **)p_Var19 + 8))();
          if (iVar6 == 7) {
            (**(code **)(**(long **)p_Var19 + 0x10))(&local_118);
            uVar17 = 0;
            if ((string *)local_118.name.field_2._M_allocated_capacity != psVar2) {
              p_Var12 = (this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_parent;
              uVar9 = local_118.name.field_2._M_allocated_capacity;
              do {
                local_148._0_8_ = &PTR_display_001ee058;
                uVar3 = *(uint *)&((_Rb_tree_node_base *)(uVar9 + 0x20))->_M_parent;
                local_148._8_4_ = uVar3;
                p_Var14 = &p_Var1->_M_header;
                for (p_Var18 = p_Var12; (_Rb_tree_header *)p_Var18 != (_Rb_tree_header *)0x0;
                    p_Var18 = (&p_Var18->_M_left)[*(uint *)((long)(p_Var18 + 1) + 8) < uVar3]) {
                  if (*(uint *)((long)(p_Var18 + 1) + 8) >= uVar3) {
                    p_Var14 = p_Var18;
                  }
                }
                p_Var15 = p_Var1;
                if (((_Rb_tree_header *)p_Var14 != p_Var1) &&
                   (p_Var15 = (_Rb_tree_header *)p_Var14, uVar3 < *(uint *)((long)p_Var14 + 0x28)))
                {
                  p_Var15 = p_Var1;
                }
                if (p_Var15 != p_Var1) {
                  pmVar11 = std::
                            map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                            ::at(local_c0,(key_type *)local_148);
                  uVar17 = pmVar11->id;
                  break;
                }
                uVar9 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar9);
                uVar17 = 0;
              } while ((string *)uVar9 != psVar2);
            }
            std::
            _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
            ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                         *)&local_118);
            if (uVar17 == 0) {
              sVar10 = std::
                       map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                       ::count(local_c0,(key_type *)(*(long *)p_Var19 + 8));
              if (sVar10 == 0) {
                uVar17 = this->varId + 1;
                this->varId = uVar17;
              }
              else {
                pmVar11 = std::
                          map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                          ::at(local_c0,(key_type *)(*(long *)p_Var19 + 8));
                uVar17 = pmVar11->id;
              }
            }
            local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
            local_40.id = *(uint32_t *)(*(long *)p_Var19 + 0x10);
            local_50._0_8_ = &PTR_display_001ee058;
            local_50._8_4_ = uVar17;
            merge(this,&local_40,(VarId *)local_50);
            tag = *(Function **)p_Var19;
            (*((Displayable *)&tag->_vptr_Function)->_vptr_Displayable[2])(&local_118);
            for (uVar9 = local_118.name.field_2._M_allocated_capacity; (string *)uVar9 != psVar2;
                uVar9 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar9)) {
              local_58 = *(undefined4 *)&((_Rb_tree_node_base *)(uVar9 + 0x20))->_M_parent;
              local_60 = (_func_int **)&PTR_display_001ee058;
              local_70.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
              tag = (Function *)&local_60;
              local_70.id = uVar17;
              merge(this,(VarId *)tag,&local_70);
            }
            std::
            _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
            ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                         *)&local_118);
            p_Var18 = local_b8;
          }
          p_Var19 = (_Base_ptr)&p_Var19->_M_parent;
        } while (p_Var19 != p_Var18);
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(local_78);
    } while (p_Var12 != local_80);
  }
  p_Var12 = (this->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var12 != local_88) {
    do {
      local_b0 = (undefined **)((ulong)local_b0 & 0xffffffffffffff00);
      AixLog::operator<<((ostream *)&local_b0,(Severity *)tag);
      local_148._0_8_ = &PTR__Tag_001edee0;
      local_148._8_8_ = &local_130;
      local_138 = 0;
      local_130 = 0;
      local_120 = 1;
      AixLog::operator<<((ostream *)local_148,(Tag *)tag);
      local_98 = std::chrono::_V2::system_clock::now();
      local_a0 = &PTR__Timestamp_001edeb0;
      local_90 = 0;
      AixLog::operator<<((ostream *)&local_a0,(Timestamp *)tag);
      local_168 = &local_158;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Conflict_Map","");
      pcVar16 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
      ;
      local_188 = &local_178;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                 ,"");
      local_118._vptr_Function = (_func_int **)&PTR__Function_001edf10;
      local_118.name._M_dataplus._M_p = (pointer)&local_118.name.field_2;
      if (local_168 == &local_158) {
        local_118.name.field_2._8_8_ = local_158._8_8_;
      }
      else {
        local_118.name._M_dataplus._M_p = (pointer)local_168;
      }
      local_118.name.field_2._M_allocated_capacity._1_7_ = local_158._M_allocated_capacity._1_7_;
      local_118.name.field_2._M_local_buf[0] = local_158._M_local_buf[0];
      local_118.name._M_string_length = local_160;
      local_160 = 0;
      local_158._M_local_buf[0] = '\0';
      local_118.file._M_dataplus._M_p = (pointer)&local_118.file.field_2;
      if (local_188 == &local_178) {
        local_118.file.field_2._8_8_ = local_178._8_8_;
      }
      else {
        local_118.file._M_dataplus._M_p = (pointer)local_188;
      }
      local_118.file.field_2._M_allocated_capacity._1_7_ = local_178._M_allocated_capacity._1_7_;
      local_118.file.field_2._M_local_buf[0] = local_178._M_local_buf[0];
      local_118.file._M_string_length = local_180;
      local_180 = 0;
      local_178._M_local_buf[0] = '\0';
      local_118.line = 0x52;
      local_118.is_null_ = false;
      local_188 = &local_178;
      local_168 = &local_158;
      AixLog::operator<<((ostream *)&local_118,(Function *)pcVar16);
      (*(code *)**(undefined8 **)(p_Var12 + 1))(p_Var12 + 1,&std::clog);
      pcVar16 = " representes these vars : ";
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog," representes these vars : ",0x1a);
      AixLog::Function::~Function(&local_118);
      if (local_188 != &local_178) {
        pcVar16 = (char *)(CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0])
                          + 1);
        operator_delete(local_188,(ulong)pcVar16);
      }
      if (local_168 != &local_158) {
        pcVar16 = (char *)(CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0])
                          + 1);
        operator_delete(local_168,(ulong)pcVar16);
      }
      local_148._0_8_ = &PTR__Tag_001edee0;
      if ((undefined1 *)local_148._8_8_ != &local_130) {
        pcVar16 = (char *)(CONCAT71(uStack_12f,local_130) + 1);
        operator_delete((void *)local_148._8_8_,(ulong)pcVar16);
      }
      local_b8 = p_Var12;
      for (p_Var13 = p_Var12[2]._M_parent; p_Var13 != (_Rb_tree_node_base *)&p_Var12[1]._M_right;
          p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
        local_b0 = &PTR_display_001ee058;
        local_a8 = *(undefined4 *)&p_Var13[1]._M_parent;
        local_189 = (ostream)0x0;
        AixLog::operator<<(&local_189,(Severity *)pcVar16);
        local_148._0_8_ = &PTR__Tag_001edee0;
        local_148._8_8_ = &local_130;
        local_138 = 0;
        local_130 = 0;
        local_120 = 1;
        AixLog::operator<<((ostream *)local_148,(Tag *)pcVar16);
        local_98 = std::chrono::_V2::system_clock::now();
        local_a0 = &PTR__Timestamp_001edeb0;
        local_90 = 0;
        AixLog::operator<<((ostream *)&local_a0,(Timestamp *)pcVar16);
        local_168 = &local_158;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Conflict_Map","");
        pcVar16 = 
        "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
        ;
        local_188 = &local_178;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_188,
                   "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                   ,"");
        local_118._vptr_Function = (_func_int **)&PTR__Function_001edf10;
        local_118.name._M_dataplus._M_p = (pointer)&local_118.name.field_2;
        if (local_168 == &local_158) {
          local_118.name.field_2._8_8_ = local_158._8_8_;
        }
        else {
          local_118.name._M_dataplus._M_p = (pointer)local_168;
        }
        local_118.name.field_2._M_allocated_capacity._1_7_ = local_158._M_allocated_capacity._1_7_;
        local_118.name.field_2._M_local_buf[0] = local_158._M_local_buf[0];
        local_118.name._M_string_length = local_160;
        local_160 = 0;
        local_158._M_local_buf[0] = '\0';
        local_118.file._M_dataplus._M_p = (pointer)&local_118.file.field_2;
        if (local_188 == &local_178) {
          local_118.file.field_2._8_8_ = local_178._8_8_;
        }
        else {
          local_118.file._M_dataplus._M_p = (pointer)local_188;
        }
        local_118.file.field_2._M_allocated_capacity._1_7_ = local_178._M_allocated_capacity._1_7_;
        local_118.file.field_2._M_local_buf[0] = local_178._M_local_buf[0];
        local_118.file._M_string_length = local_180;
        local_180 = 0;
        local_178._M_local_buf[0] = '\0';
        local_118.line = 0x54;
        local_118.is_null_ = false;
        local_188 = &local_178;
        local_168 = &local_158;
        AixLog::operator<<((ostream *)&local_118,(Function *)pcVar16);
        (*(code *)*local_b0)(&local_b0,&std::clog);
        pcVar16 = ", ";
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,", ",2);
        AixLog::Function::~Function(&local_118);
        if (local_188 != &local_178) {
          pcVar16 = (char *)(CONCAT71(local_178._M_allocated_capacity._1_7_,
                                      local_178._M_local_buf[0]) + 1);
          operator_delete(local_188,(ulong)pcVar16);
        }
        if (local_168 != &local_158) {
          pcVar16 = (char *)(CONCAT71(local_158._M_allocated_capacity._1_7_,
                                      local_158._M_local_buf[0]) + 1);
          operator_delete(local_168,(ulong)pcVar16);
        }
        local_148._0_8_ = &PTR__Tag_001edee0;
        if ((undefined1 *)local_148._8_8_ != &local_130) {
          pcVar16 = (char *)(CONCAT71(uStack_12f,local_130) + 1);
          operator_delete((void *)local_148._8_8_,(ulong)pcVar16);
        }
      }
      local_b0 = (undefined **)((ulong)local_b0 & 0xffffffffffffff00);
      AixLog::operator<<((ostream *)&local_b0,(Severity *)pcVar16);
      local_148._0_8_ = &PTR__Tag_001edee0;
      local_148._8_8_ = &local_130;
      local_138 = 0;
      local_130 = 0;
      local_120 = 1;
      AixLog::operator<<((ostream *)local_148,(Tag *)pcVar16);
      p_Var12 = local_b8;
      local_98 = std::chrono::_V2::system_clock::now();
      local_a0 = &PTR__Timestamp_001edeb0;
      local_90 = 0;
      AixLog::operator<<((ostream *)&local_a0,(Timestamp *)pcVar16);
      local_168 = &local_158;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Conflict_Map","");
      pcVar16 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
      ;
      local_188 = &local_178;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                 ,"");
      local_118._vptr_Function._0_4_ = 0x1edf10;
      local_118._vptr_Function._4_4_ = 0;
      local_118.name._M_dataplus._M_p = (pointer)&local_118.name.field_2;
      if (local_168 == &local_158) {
        local_118.name.field_2._8_8_ = local_158._8_8_;
      }
      else {
        local_118.name._M_dataplus._M_p = (pointer)local_168;
      }
      local_118.name.field_2._M_allocated_capacity._1_7_ = local_158._M_allocated_capacity._1_7_;
      local_118.name.field_2._M_local_buf[0] = local_158._M_local_buf[0];
      local_118.name._M_string_length = local_160;
      local_160 = 0;
      local_158._M_local_buf[0] = '\0';
      local_118.file._M_dataplus._M_p = (pointer)&local_118.file.field_2;
      if (local_188 == &local_178) {
        local_118.file.field_2._8_8_ = local_178._8_8_;
      }
      else {
        local_118.file._M_dataplus._M_p = (pointer)local_188;
      }
      local_118.file.field_2._M_allocated_capacity._1_7_ = local_178._M_allocated_capacity._1_7_;
      local_118.file.field_2._M_local_buf[0] = local_178._M_local_buf[0];
      local_118.file._M_string_length = local_180;
      local_180 = 0;
      local_178._M_local_buf[0] = '\0';
      local_118.line = 0x56;
      local_118.is_null_ = false;
      local_188 = &local_178;
      local_168 = &local_158;
      AixLog::operator<<((ostream *)&local_118,(Function *)pcVar16);
      cVar5 = std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
      tag = (Function *)(ulong)(uint)(int)cVar5;
      std::ostream::put(-0x80);
      std::ostream::flush();
      AixLog::Function::~Function(&local_118);
      if (local_188 != &local_178) {
        tag = (Function *)
              (CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0]) + 1);
        operator_delete(local_188,(ulong)tag);
      }
      if (local_168 != &local_158) {
        tag = (Function *)
              (CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]) + 1);
        operator_delete(local_168,(ulong)tag);
      }
      local_148._0_8_ = &PTR__Tag_001edee0;
      if ((undefined1 *)local_148._8_8_ != &local_130) {
        tag = (Function *)(CONCAT71(uStack_12f,local_130) + 1);
        operator_delete((void *)local_148._8_8_,(ulong)tag);
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while (p_Var12 != local_88);
  }
  return;
}

Assistant:

Conflict_Map(std::shared_ptr<Color_Map> color_map,
               mir::inst::MirFunction& func, u_int color_num = 8)
      : color_num(color_num), color_map(color_map), func(func) {
    unused_colors = std::make_shared<std::set<int>>();
    for (int i = 0; i < color_num; i++) {
      unused_colors->insert(i);
    }
    if (func.variables.size()) {
      auto end_iter = func.variables.end();
      end_iter--;
      varId = end_iter->first;
    } else {
      varId = mir::inst::VarId(65535);
    }
    for (auto& blkiter : func.basic_blks) {
      for (auto& inst : blkiter.second.inst) {
        if (inst->inst_kind() == mir::inst::InstKind::Phi) {
          mir::inst::VarId new_VarId(0);
          for (auto var : inst->useVars()) {
            if (merged_var_Map.count(var)) {
              new_VarId = merged_var_Map.at(var);
              break;
            }
          }
          if (new_VarId.id == 0) {
            if (merged_var_Map.count(inst->dest)) {
              new_VarId = merged_var_Map.at(inst->dest);
            } else {
              new_VarId = get_new_VarId();
            }
          }
          merge(inst->dest, new_VarId);
          for (auto var : inst->useVars()) {
            merge(var, new_VarId);
          }
          // LOG(TRACE) << new_VarId << " : ";
          // for (auto var : inst->useVars()) {
          //   LOG(TRACE) << var << ", ";
          // }
          // LOG(TRACE) << std::endl;
        }
      }
    }
    for (auto& pair : merged_Map) {
      LOG(TRACE) << pair.first << " representes these vars : ";
      for (auto var : pair.second) {
        LOG(TRACE) << var << ", ";
      }
      LOG(TRACE) << std::endl;
    }
  }